

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O3

Type * QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>_>::
       instance(void)

{
  QBasicMutex QVar1;
  void **ppvVar2;
  undefined4 *puVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  Connection local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  QArrayData *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>>::
      instance()::holder == '\0') {
    QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>>::
    instance();
  }
  if ((__atomic_base<signed_char>)
      QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>::guard._q_value.
      super___atomic_base<signed_char>._M_i != -1) {
    if ((AtomicType)
        QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>::mutex.d_ptr.
        _q_value._M_b._M_p == (AtomicType)0x0) {
      LOCK();
      QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>::mutex.d_ptr.
      _q_value._M_b._M_p = (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x1;
      UNLOCK();
    }
    else {
      QBasicMutex::lockInternal();
    }
    if ((__atomic_base<signed_char>)
        QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>::guard._q_value.
        super___atomic_base<signed_char>._M_i == '\0') {
      QVar4.m_data = (storage_type *)0xe;
      QVar4.m_size = (qsizetype)&local_48;
      QString::fromLatin1(QVar4);
      local_68.d_ptr = local_48;
      uStack_60 = uStack_40;
      local_58 = local_38;
      QFactoryLoader::QFactoryLoader
                ((QFactoryLoader *)
                 &QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>::
                  storage,"org.qt-project.Qt.NetworkAccessBackendFactory",(QString *)&local_68,
                 CaseSensitive);
      if ((QArrayData *)local_68.d_ptr != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_68.d_ptr = *local_68.d_ptr + -1;
        UNLOCK();
        if (*local_68.d_ptr == 0) {
          QArrayData::deallocate((QArrayData *)local_68.d_ptr,2,0x10);
        }
      }
      ppvVar2 = QCoreApplication::self;
      local_48 = (QArrayData *)QObject::destroyed;
      uStack_40 = 0;
      puVar3 = (undefined4 *)operator_new(0x18);
      *puVar3 = 1;
      *(code **)(puVar3 + 2) = QtPrivate::QCallableObject<void_(*)(),_QtPrivate::List<>,_void>::impl
      ;
      *(code **)(puVar3 + 4) =
           QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>::reset;
      QObject::connectImpl
                ((QObject *)&local_68,ppvVar2,(QObject *)&local_48,ppvVar2,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar3,(int *)0x1,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection(&local_68);
      QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>::guard._q_value.
      super___atomic_base<signed_char>._M_i = (Type)(__atomic_base<signed_char>)0xff;
    }
    QVar1.d_ptr._q_value._M_b._M_p =
         QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>::mutex.d_ptr.
         _q_value._M_b._M_p;
    LOCK();
    QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>::mutex.d_ptr.
    _q_value._M_b._M_p = (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x0;
    UNLOCK();
    if ((AtomicType)QVar1.d_ptr._q_value._M_b._M_p != (AtomicType)0x1) {
      QBasicMutex::unlockInternalFutex
                (&QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>::mutex
                );
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (Type *)&QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>::
                  storage;
}

Assistant:

static Type *instance() noexcept(Holder::ConstructionIsNoexcept)
    {
        static Holder holder;
        return holder.pointer();
    }